

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

ssize_t __thiscall
capnp::LocalRequest::send(LocalRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  long *plVar4;
  Refcounted *refcounted;
  undefined4 in_register_00000034;
  long lVar5;
  ForkedPromise<void> forked;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>,_void>
  promise;
  Own<capnp::LocalCallContext> context;
  Fault f;
  VoidPromiseAndPipeline promiseAndPipeline;
  PromiseFulfillerPair<void> cancelPaf;
  anon_class_1_0_00000001_for_errorHandler local_d9;
  Own<kj::_::ForkHub<kj::_::Void>_> local_d8;
  undefined1 local_c8 [32];
  Own<capnp::LocalCallContext> local_a8;
  Pipeline local_98;
  Own<capnp::LocalCallContext> local_70;
  VoidPromiseAndPipeline local_60;
  PromiseFulfillerPair<void> local_40;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  if (*(long *)(lVar5 + 0x10) != 0) {
    uVar3 = *(undefined8 *)(lVar5 + 0x18);
    uVar2 = *(undefined2 *)(lVar5 + 0x20);
    kj::newPromiseAndFulfiller<void>();
    (**(code **)(**(long **)(lVar5 + 0x30) + 0x20))(&local_98);
    kj::
    refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder>,kj::Own<capnp::ClientHook>,kj::Own<kj::PromiseFulfiller<void>>>
              ((kj *)&local_a8,(Own<capnp::MallocMessageBuilder> *)(lVar5 + 8),
               (Own<capnp::ClientHook> *)&local_98,&local_40.fulfiller);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_98);
    plVar4 = *(long **)(lVar5 + 0x30);
    local_d8.disposer = &((local_a8.ptr)->super_Refcounted).super_Disposer;
    puVar1 = &((local_a8.ptr)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_98.hook.ptr = (PipelineHook *)local_a8.ptr;
    local_d8.ptr = (ForkHub<kj::_::Void> *)0x0;
    local_98.hook.disposer = local_d8.disposer;
    (**(code **)(*plVar4 + 8))(&local_60,plVar4,uVar3,uVar2);
    kj::Own<capnp::CallContextHook>::dispose((Own<capnp::CallContextHook> *)&local_98);
    kj::Own<capnp::LocalCallContext>::dispose((Own<capnp::LocalCallContext> *)&local_d8);
    kj::Promise<void>::fork((Promise<void> *)&local_d8);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_c8);
    puVar1 = &((local_a8.ptr)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_70.disposer = &((local_a8.ptr)->super_Refcounted).super_Disposer;
    local_70.ptr = local_a8.ptr;
    kj::Promise<void>::attach<kj::Own<capnp::LocalCallContext>>
              ((Promise<void> *)(local_c8 + 0x10),(Own<capnp::LocalCallContext> *)local_c8);
    kj::Promise<void>::exclusiveJoin((Promise<void> *)&local_98,(Promise<void> *)(local_c8 + 0x10));
    kj::Promise<void>::detach<capnp::LocalRequest::send()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)&local_98,&local_d9);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_c8 + 0x10));
    kj::Own<capnp::LocalCallContext>::dispose(&local_70);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_c8);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_c8);
    local_98.hook.ptr = (PipelineHook *)local_a8.disposer;
    local_98.ops.ptr = (PipelineOp *)local_a8.ptr;
    local_a8.ptr = (LocalCallContext *)0x0;
    kj::Promise<void>::
    then<kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>
              ((Promise<void> *)(local_c8 + 0x10),
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>
                *)local_c8,(PropagateException *)&local_98);
    kj::Own<capnp::LocalCallContext>::dispose((Own<capnp::LocalCallContext> *)&local_98.hook.ptr);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_c8);
    local_98.hook.disposer = local_60.pipeline.disposer;
    local_98.hook.ptr = local_60.pipeline.ptr;
    local_60.pipeline.ptr = (PipelineHook *)0x0;
    local_98.ops.ptr = (PipelineOp *)0x0;
    local_98.ops.size_ = 0;
    local_98.ops.disposer = (ArrayDisposer *)0x0;
    RemotePromise<capnp::AnyPointer>::RemotePromise
              ((RemotePromise<capnp::AnyPointer> *)this,
               (Promise<capnp::Response<capnp::AnyPointer>_> *)(local_c8 + 0x10),&local_98);
    AnyPointer::Pipeline::~Pipeline(&local_98);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_c8 + 0x10));
    kj::Own<kj::_::ForkHub<kj::_::Void>_>::dispose(&local_d8);
    ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline(&local_60);
    kj::Own<capnp::LocalCallContext>::dispose(&local_a8);
    kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_40);
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
            ((Fault *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0xbe,FAILED,"message.get() != nullptr","\"Already called send() on this request.\"",
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal((Fault *)&local_98);
}

Assistant:

RemotePromise<AnyPointer> send() override {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    // For the lambda capture.
    uint64_t interfaceId = this->interfaceId;
    uint16_t methodId = this->methodId;

    auto cancelPaf = kj::newPromiseAndFulfiller<void>();

    auto context = kj::refcounted<LocalCallContext>(
        kj::mv(message), client->addRef(), kj::mv(cancelPaf.fulfiller));
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context));

    // We have to make sure the call is not canceled unless permitted.  We need to fork the promise
    // so that if the client drops their copy, the promise isn't necessarily canceled.
    auto forked = promiseAndPipeline.promise.fork();

    // We daemonize one branch, but only after joining it with the promise that fires if
    // cancellation is allowed.
    forked.addBranch()
        .attach(kj::addRef(*context))
        .exclusiveJoin(kj::mv(cancelPaf.promise))
        .detach([](kj::Exception&&) {});  // ignore exceptions

    // Now the other branch returns the response from the context.
    auto promise = forked.addBranch().then(kj::mvCapture(context,
        [](kj::Own<LocalCallContext>&& context) {
      context->getResults(MessageSize { 0, 0 });  // force response allocation
      return kj::mv(KJ_ASSERT_NONNULL(context->response));
    }));

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }